

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateExternalFunction
          (JavascriptLibrary *this,ExternalMethod entryPoint,PropertyId nameId,Var signature,
          UINT64 flags,bool isLengthAvailable)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  undefined4 *puVar3;
  Var nameId_00;
  JavascriptExternalFunction *pJVar4;
  bool isLengthAvailable_local;
  UINT64 flags_local;
  Var signature_local;
  PropertyId nameId_local;
  ExternalMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  if (nameId != 0) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar2 = ScriptContext::IsTrackedPropertyId(this_00,nameId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x169c,
                                  "(nameId == 0 || scriptContext->IsTrackedPropertyId(nameId))",
                                  "nameId == 0 || scriptContext->IsTrackedPropertyId(nameId)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  nameId_00 = TaggedInt::ToVarUnchecked(nameId);
  pJVar4 = CreateExternalFunction(this,entryPoint,nameId_00,signature,flags,isLengthAvailable);
  return pJVar4;
}

Assistant:

JavascriptExternalFunction*
    JavascriptLibrary::CreateExternalFunction(ExternalMethod entryPoint, PropertyId nameId, Var signature, UINT64 flags, bool isLengthAvailable)
    {
        Assert(nameId == 0 || scriptContext->IsTrackedPropertyId(nameId));
        return CreateExternalFunction(entryPoint, TaggedInt::ToVarUnchecked(nameId), signature, flags, isLengthAvailable);
    }